

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall mocker::SyntaxError::~SyntaxError(SyntaxError *this)

{
  CompileError::~CompileError(&this->super_CompileError);
  operator_delete(this,0x48);
  return;
}

Assistant:

SyntaxError(const Position &beg, const Position &end)
      : CompileError(beg, end) {}